

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O1

RGBColor __thiscall pm::Matte::shade(Matte *this,ShadeRecord *sr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long *plVar4;
  bool bVar5;
  char cVar6;
  ulong uVar7;
  long in_RDX;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  RGBColor RVar12;
  Ray shadowRay;
  Vector3 wi;
  float local_78;
  float local_74;
  float local_70;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  Matte *local_38;
  
  fVar11 = (sr->normal).z;
  fVar1 = (sr->ray).o.x;
  fVar10 = (sr->ray).o.y;
  fVar2 = (sr->ray).o.z;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_5c);
  fVar10 = fVar10 * fVar11 * local_58;
  *(float *)&(this->super_Material)._vptr_Material = fVar1 * fVar11 * local_5c;
  *(float *)((long)&(this->super_Material)._vptr_Material + 4) = fVar10;
  (this->super_Material).type_ = (Type)(fVar11 * fVar2 * local_54);
  local_74 = *(float *)&(this->super_Material)._vptr_Material;
  local_78 = *(float *)((long)&(this->super_Material)._vptr_Material + 4);
  local_70 = (float)(this->super_Material).type_;
  lVar8 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  local_38 = this;
  if (lVar8 != 0) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      plVar4 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar7 * 8);
      (**(code **)(*plVar4 + 0x10))(&local_44,plVar4);
      fVar11 = *(float *)(in_RDX + 0x30) * local_3c +
               *(float *)(in_RDX + 0x28) * local_44 + *(float *)(in_RDX + 0x2c) * local_40;
      fVar10 = local_40;
      if (0.0 < fVar11) {
        if (*(char *)((long)plVar4 + 0xc) == '\x01') {
          local_5c = *(float *)(in_RDX + 0x10);
          local_58 = *(float *)(in_RDX + 0x14);
          local_54 = *(float *)(in_RDX + 0x18);
          local_50 = local_44;
          local_4c = local_40;
          local_48 = local_3c;
          cVar6 = (**(code **)(*plVar4 + 0x20))(plVar4,&local_5c);
          if (cVar6 != '\0') goto LAB_0010e721;
        }
        fVar1 = *(float *)&sr->world;
        fVar10 = *(float *)((long)&sr->world + 4);
        fVar2 = *(float *)&sr->tracer;
        fVar3 = *(float *)((long)&sr->tracer + 4);
        (**(code **)(*plVar4 + 0x18))(&local_5c,plVar4);
        fVar10 = fVar10 * fVar1 * 0.31830987 * local_5c * fVar11;
        local_74 = local_74 + fVar10;
        local_78 = local_78 + fVar2 * fVar1 * 0.31830987 * local_58 * fVar11;
        local_70 = local_70 + fVar1 * fVar3 * 0.31830987 * local_54 * fVar11;
      }
LAB_0010e721:
      bVar5 = uVar9 < (ulong)(lVar8 >> 3);
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar5);
  }
  *(float *)&(local_38->super_Material)._vptr_Material = local_74;
  *(float *)((long)&(local_38->super_Material)._vptr_Material + 4) = local_78;
  RVar12.g = 0.0;
  RVar12.r = local_70;
  (local_38->super_Material).type_ = (Type)local_70;
  RVar12.b = fVar10;
  return RVar12;
}

Assistant:

RGBColor Matte::shade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * nDotWi;
		}
	}

	return L;
}